

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int freeSpace(MemPage *pPage,u16 iStart,u16 iSize)

{
  ulong uVar1;
  u8 *puVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  undefined6 in_register_00000012;
  ulong uVar6;
  ulong uVar7;
  undefined6 in_register_00000032;
  ushort uVar8;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  byte bVar13;
  ushort uVar14;
  uint uVar15;
  ulong uVar9;
  
  uVar7 = CONCAT62(in_register_00000032,iStart);
  uVar6 = CONCAT62(in_register_00000012,iSize) & 0xffffffff;
  iVar3 = (int)CONCAT62(in_register_00000012,iSize);
  uVar12 = (uint)uVar7;
  uVar5 = iVar3 + uVar12;
  puVar2 = pPage->aData;
  uVar4 = (ulong)pPage->hdrOffset;
  uVar1 = uVar4 + 1;
  uVar9 = uVar1;
  if ((puVar2[uVar4 + 2] == '\0') && (puVar2[uVar1] == '\0')) {
    uVar8 = 0;
    uVar10 = uVar1;
  }
  else {
    do {
      uVar10 = uVar9;
      uVar14 = *(ushort *)(puVar2 + uVar10);
      uVar8 = uVar14 << 8 | uVar14 >> 8;
      uVar9 = (ulong)uVar8;
      if (iStart <= uVar8) goto LAB_00175988;
    } while ((ushort)uVar10 < uVar8);
    if (uVar8 != 0) {
      iVar3 = 0x11110;
      goto LAB_00175b1b;
    }
LAB_00175988:
    uVar11 = pPage->pBt->usableSize;
    uVar15 = (uint)uVar8;
    if (uVar11 - 4 < uVar15) {
      iVar3 = 0x11115;
      goto LAB_00175b1b;
    }
    if (uVar5 + 3 < uVar15 || uVar8 == 0) {
      bVar13 = 0;
    }
    else {
      bVar13 = (char)(uVar14 >> 8) - (char)uVar5;
      if (uVar8 < uVar5) {
        iVar3 = 0x11121;
        goto LAB_00175b1b;
      }
      uVar5 = (ushort)(*(ushort *)(puVar2 + uVar9 + 2) << 8 | *(ushort *)(puVar2 + uVar9 + 2) >> 8)
              + uVar15;
      if (uVar11 < uVar5) {
        iVar3 = 0x11124;
        goto LAB_00175b1b;
      }
      uVar6 = (ulong)(uVar5 - uVar12);
      uVar8 = *(ushort *)(puVar2 + uVar9) << 8 | *(ushort *)(puVar2 + uVar9) >> 8;
    }
    uVar11 = (uint)uVar10;
    if (((uint)uVar1 < uVar11) &&
       (uVar14 = *(ushort *)(puVar2 + uVar10 + 2) << 8 | *(ushort *)(puVar2 + uVar10 + 2) >> 8,
       uVar12 <= uVar14 + uVar11 + 3)) {
      uVar15 = uVar14 + uVar11;
      if (uVar12 < uVar15) {
        iVar3 = 0x11131;
        goto LAB_00175b1b;
      }
      bVar13 = bVar13 + ((char)iStart - (char)uVar15);
      uVar6 = (ulong)(uVar5 - uVar11);
      uVar7 = uVar10;
    }
    if (puVar2[uVar4 + 7] < bVar13) {
      iVar3 = 0x11137;
      goto LAB_00175b1b;
    }
    puVar2[uVar4 + 7] = puVar2[uVar4 + 7] - bVar13;
    uVar12 = (uint)uVar7 & 0xffff;
  }
  uVar11 = (uint)(ushort)(*(ushort *)(puVar2 + uVar4 + 5) << 8 |
                         *(ushort *)(puVar2 + uVar4 + 5) >> 8);
  if (uVar12 <= uVar11) {
    if (uVar12 < uVar11) {
      iVar3 = 0x11140;
    }
    else {
      if ((uint)uVar1 == (uint)uVar10) {
        *(ushort *)(puVar2 + uVar1) = uVar8 << 8 | uVar8 >> 8;
        puVar2[uVar4 + 5] = (u8)(uVar5 >> 8);
        puVar2[uVar4 + 6] = (u8)uVar5;
        goto LAB_00175aa1;
      }
      iVar3 = 0x11141;
    }
LAB_00175b1b:
    iVar3 = sqlite3CorruptError(iVar3);
    return iVar3;
  }
  *(ushort *)(puVar2 + uVar10) = (ushort)uVar7 << 8 | (ushort)uVar7 >> 8;
LAB_00175aa1:
  uVar7 = uVar7 & 0xffff;
  if ((pPage->pBt->btsFlags & 0xc) != 0) {
    memset(puVar2 + uVar7,0,uVar6 & 0xffff);
  }
  puVar2[uVar7] = (u8)(uVar8 >> 8);
  puVar2[uVar7 + 1] = (u8)uVar8;
  puVar2[uVar7 + 2] = (u8)(uVar6 >> 8);
  puVar2[uVar7 + 3] = (u8)uVar6;
  pPage->nFree = pPage->nFree + iVar3;
  return 0;
}

Assistant:

static int freeSpace(MemPage *pPage, u16 iStart, u16 iSize){
  u16 iPtr;                             /* Address of ptr to next freeblock */
  u16 iFreeBlk;                         /* Address of the next freeblock */
  u8 hdr;                               /* Page header size.  0 or 100 */
  u8 nFrag = 0;                         /* Reduction in fragmentation */
  u16 iOrigSize = iSize;                /* Original value of iSize */
  u16 x;                                /* Offset to cell content area */
  u32 iEnd = iStart + iSize;            /* First byte past the iStart buffer */
  unsigned char *data = pPage->aData;   /* Page content */
  u8 *pTmp;                             /* Temporary ptr into data[] */

  assert( pPage->pBt!=0 );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( CORRUPT_DB || iStart>=pPage->hdrOffset+6+pPage->childPtrSize );
  assert( CORRUPT_DB || iEnd <= pPage->pBt->usableSize );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( iSize>=4 );   /* Minimum cell size is 4 */
  assert( iStart<=pPage->pBt->usableSize-4 );

  /* The list of freeblocks must be in ascending order.  Find the
  ** spot on the list where iStart should be inserted.
  */
  hdr = pPage->hdrOffset;
  iPtr = hdr + 1;
  if( data[iPtr+1]==0 && data[iPtr]==0 ){
    iFreeBlk = 0;  /* Shortcut for the case when the freelist is empty */
  }else{
    while( (iFreeBlk = get2byte(&data[iPtr]))<iStart ){
      if( iFreeBlk<=iPtr ){
        if( iFreeBlk==0 ) break; /* TH3: corrupt082.100 */
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iPtr = iFreeBlk;
    }
    if( iFreeBlk>pPage->pBt->usableSize-4 ){ /* TH3: corrupt081.100 */
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( iFreeBlk>iPtr || iFreeBlk==0 || CORRUPT_DB );

    /* At this point:
    **    iFreeBlk:   First freeblock after iStart, or zero if none
    **    iPtr:       The address of a pointer to iFreeBlk
    **
    ** Check to see if iFreeBlk should be coalesced onto the end of iStart.
    */
    if( iFreeBlk && iEnd+3>=iFreeBlk ){
      nFrag = iFreeBlk - iEnd;
      if( iEnd>iFreeBlk ) return SQLITE_CORRUPT_PAGE(pPage);
      iEnd = iFreeBlk + get2byte(&data[iFreeBlk+2]);
      if( iEnd > pPage->pBt->usableSize ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iSize = iEnd - iStart;
      iFreeBlk = get2byte(&data[iFreeBlk]);
    }

    /* If iPtr is another freeblock (that is, if iPtr is not the freelist
    ** pointer in the page header) then check to see if iStart should be
    ** coalesced onto the end of iPtr.
    */
    if( iPtr>hdr+1 ){
      int iPtrEnd = iPtr + get2byte(&data[iPtr+2]);
      if( iPtrEnd+3>=iStart ){
        if( iPtrEnd>iStart ) return SQLITE_CORRUPT_PAGE(pPage);
        nFrag += iStart - iPtrEnd;
        iSize = iEnd - iPtr;
        iStart = iPtr;
      }
    }
    if( nFrag>data[hdr+7] ) return SQLITE_CORRUPT_PAGE(pPage);
    data[hdr+7] -= nFrag;
  }
  pTmp = &data[hdr+5];
  x = get2byte(pTmp);
  if( iStart<=x ){
    /* The new freeblock is at the beginning of the cell content area,
    ** so just extend the cell content area rather than create another
    ** freelist entry */
    if( iStart<x ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iPtr!=hdr+1 ) return SQLITE_CORRUPT_PAGE(pPage);
    put2byte(&data[hdr+1], iFreeBlk);
    put2byte(&data[hdr+5], iEnd);
  }else{
    /* Insert the new freeblock into the freelist */
    put2byte(&data[iPtr], iStart);
  }
  if( pPage->pBt->btsFlags & BTS_FAST_SECURE ){
    /* Overwrite deleted information with zeros when the secure_delete
    ** option is enabled */
    memset(&data[iStart], 0, iSize);
  }
  put2byte(&data[iStart], iFreeBlk);
  put2byte(&data[iStart+2], iSize);
  pPage->nFree += iOrigSize;
  return SQLITE_OK;
}